

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O3

void gkc_summary_free(gkc_summary *s)

{
  list **pplVar1;
  uint64_t uVar2;
  list *plVar3;
  list *__ptr;
  
  plVar3 = (s->head).next;
  if (plVar3 == &s->head) {
    __ptr = (list *)s->fl;
    if (__ptr == (list *)0x0) goto LAB_00123ab7;
  }
  else {
    uVar2 = s->alloced;
    __ptr = (list *)s->fl;
    do {
      pplVar1 = &plVar3->next;
      uVar2 = uVar2 - 1;
      plVar3[-2].next = __ptr;
      __ptr = (list *)&plVar3[-2].next;
      plVar3 = *pplVar1;
    } while (*pplVar1 != &s->head);
    s->alloced = uVar2;
    s->fl = (freelist *)__ptr;
  }
  do {
    plVar3 = __ptr->prev;
    free(__ptr);
    __ptr = plVar3;
  } while (plVar3 != (list *)0x0);
LAB_00123ab7:
  free(s);
  return;
}

Assistant:

void gkc_summary_free(struct gkc_summary *s)
{
    struct freelist *fl;
    struct list *cur;

    cur = s->head.next;
    while (cur != &s->head) {
        struct list *next;
        next = cur->next;
        gkc_free(s, list_to_tuple(cur));
        cur = next;
    }
    fl = s->fl;
    while (fl) {
        void *p;
        p = fl;
        fl = fl->next;
        free(p);
    }
    free(s);
}